

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

void ReadVocab(void)

{
  int iVar1;
  FILE *pFVar2;
  char *__s;
  char c;
  char word [100];
  undefined1 local_89;
  char local_88 [104];
  
  puts("Reading vocabulary...");
  pFVar2 = fopen(read_vocab_file,"rb");
  if (pFVar2 == (FILE *)0x0) {
    __s = "Vocabulary file not found";
LAB_00103333:
    puts(__s);
    exit(1);
  }
  memset(vocab_hash,0xff,120000000);
  vocab_size = 0;
  ReadWord(local_88,(FILE *)pFVar2);
  iVar1 = feof(pFVar2);
  if (iVar1 == 0) {
    do {
      iVar1 = AddWordToVocab(local_88);
      __isoc99_fscanf(pFVar2,"%lld%c",vocab + iVar1,&local_89);
      ReadWord(local_88,(FILE *)pFVar2);
      iVar1 = feof(pFVar2);
    } while (iVar1 == 0);
  }
  SortVocab();
  if (0 < debug_mode) {
    printf("Vocab size: %lld\n",vocab_size);
    printf("Words in train file: %lld\n",train_words);
  }
  if (1 < num_threads) {
    pFVar2 = fopen(train_file,"rb");
    if (pFVar2 == (FILE *)0x0) {
      __s = "ERROR: training data file not found!";
      goto LAB_00103333;
    }
    fseek(pFVar2,0,2);
    file_size = ftell(pFVar2);
    fclose(pFVar2);
  }
  return;
}

Assistant:

void ReadVocab() {
  printf("Reading vocabulary...\n");
  long long a, i = 0;
  char c;
  char word[MAX_STRING];
  FILE *fin = fopen(read_vocab_file, "rb");
  if (fin == NULL) {
    printf("Vocabulary file not found\n");
    exit(1);
  }
  for (a = 0; a < vocab_hash_size; a++) vocab_hash[a] = -1;
  vocab_size = 0;
  while (1) {
    ReadWord(word, fin);
    if (feof(fin)) break;
    a = AddWordToVocab(word);
    fscanf(fin, "%lld%c", &vocab[a].cn, &c);
    i++;
  }
  SortVocab();
  if (debug_mode > 0) {
    printf("Vocab size: %lld\n", vocab_size);
    printf("Words in train file: %lld\n", train_words);
  }

  // Don't do this if piping...
  if (num_threads > 1) {
    fin = fopen(train_file, "rb");
    if (fin == NULL) {
      printf("ERROR: training data file not found!\n");
      exit(1);
    }
    fseek(fin, 0, SEEK_END);
    file_size = ftell(fin);
    fclose(fin);
  }
}